

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O2

bool llvm::sys::locale::isPrint(int UCS)

{
  bool bVar1;
  int iVar2;
  CharRanges Ranges;
  
  if (unicode::isPrintable(int)::NonPrintables == '\0') {
    iVar2 = __cxa_guard_acquire(&unicode::isPrintable(int)::NonPrintables);
    if (iVar2 != 0) {
      Ranges.Length = 0x224;
      Ranges.Data = unicode::isPrintable::NonPrintableRanges;
      UnicodeCharSet::UnicodeCharSet(&unicode::isPrintable::NonPrintables,Ranges);
      __cxa_guard_release(&unicode::isPrintable(int)::NonPrintables);
    }
  }
  if ((uint)UCS < 0x110000) {
    bVar1 = UnicodeCharSet::contains(&unicode::isPrintable::NonPrintables,UCS);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isPrint(int UCS) {
#if _WIN32
  // Restrict characters that we'll try to print to the lower part of ASCII
  // except for the control characters (0x20 - 0x7E). In general one can not
  // reliably output code points U+0080 and higher using narrow character C/C++
  // output functions in Windows, because the meaning of the upper 128 codes is
  // determined by the active code page in the console.
  return ' ' <= UCS && UCS <= '~';
#else
  return llvm::sys::unicode::isPrintable(UCS);
#endif
}